

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irq.c
# Opt level: O3

void getkey(void)

{
  byte bVar1;
  ubyte uVar2;
  uint uVar3;
  undefined8 unaff_RBX;
  ulong uVar4;
  
  if (getkey::pressed == '\0') {
    bVar1 = _bios_keybrd(0);
    current_shift = bVar1 & 3;
  }
  uVar2 = _bios_keybrd(0);
  uVar4 = CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
  uVar3 = (uint)uVar4;
  if (uVar2 != '\0') {
    if (getkey::pressed == '\0') {
      bVar1 = peekb(0,0x417);
      bVar1 = s_via_latch[6] | bVar1 & 0x40;
      if ((bVar1 == 0x48) || (bVar1 == 0)) {
        current_key = '@';
      }
      else {
        bVar1 = _bios_keybrd(0);
        uVar3 = (uint)bVar1;
        getkey::pressed = '\a';
        switch(bVar1) {
        case 8:
          current_key = 'Y';
          current_shift = '\0';
          uVar3 = 8;
          break;
        case 9:
          current_key = '`';
          current_shift = '\0';
          uVar3 = 9;
          break;
        case 0xd:
          current_key = 'I';
          current_shift = '\0';
          uVar3 = 0xd;
          break;
        case 0x1b:
          current_key = 'p';
          current_shift = '\0';
          uVar3 = 0x1b;
          break;
        case 0x20:
          current_key = 'b';
          current_shift = '\0';
          uVar3 = 0x20;
          break;
        case 0x21:
          current_key = '0';
          current_shift = '\x01';
          uVar3 = 0x21;
          break;
        case 0x22:
          current_key = '1';
          current_shift = '\x01';
          uVar3 = 0x22;
          break;
        case 0x23:
          current_key = '\x11';
          current_shift = '\x01';
          uVar3 = 0x23;
          break;
        case 0x24:
          current_key = '\x12';
          current_shift = '\x01';
          uVar3 = 0x24;
          break;
        case 0x25:
          current_key = '\x13';
          current_shift = '\x01';
          uVar3 = 0x25;
          break;
        case 0x26:
          current_key = '4';
          current_shift = '\x01';
          uVar3 = 0x26;
          break;
        case 0x27:
          current_key = '$';
          current_shift = '\x01';
          uVar3 = 0x27;
          break;
        case 0x28:
          current_key = '\x15';
          current_shift = '\x01';
          uVar3 = 0x28;
          break;
        case 0x29:
          current_key = '&';
          current_shift = '\x01';
          uVar3 = 0x29;
          break;
        case 0x2a:
          current_key = 'H';
          current_shift = '\x01';
          uVar3 = 0x2a;
          break;
        case 0x2b:
          current_key = 'W';
          current_shift = '\x01';
          uVar3 = 0x2b;
          break;
        case 0x2c:
          current_key = 'f';
          current_shift = '\0';
          uVar3 = 0x2c;
          break;
        case 0x2d:
          current_key = '\x17';
          current_shift = '\0';
          uVar3 = 0x2d;
          break;
        case 0x2e:
          current_key = 'g';
          current_shift = '\0';
          uVar3 = 0x2e;
          break;
        case 0x2f:
          current_key = 'h';
          current_shift = '\0';
          uVar3 = 0x2f;
          break;
        case 0x30:
          current_key = '\'';
          current_shift = '\0';
          uVar3 = 0x30;
          break;
        case 0x31:
          current_key = '0';
          current_shift = '\0';
          uVar3 = 0x31;
          break;
        case 0x32:
          current_key = '1';
          current_shift = '\0';
          uVar3 = 0x32;
          break;
        case 0x33:
          current_key = '\x11';
          current_shift = '\0';
          uVar3 = 0x33;
          break;
        case 0x34:
          current_key = '\x12';
          current_shift = '\0';
          uVar3 = 0x34;
          break;
        case 0x35:
          current_key = '\x13';
          current_shift = '\0';
          uVar3 = 0x35;
          break;
        case 0x36:
          current_key = '4';
          current_shift = '\0';
          uVar3 = 0x36;
          break;
        case 0x37:
          current_key = '$';
          current_shift = '\0';
          uVar3 = 0x37;
          break;
        case 0x38:
          current_key = '\x15';
          current_shift = '\0';
          uVar3 = 0x38;
          break;
        case 0x39:
          current_key = '&';
          current_shift = '\0';
          uVar3 = 0x39;
          break;
        case 0x3a:
          current_key = 'H';
          current_shift = '\0';
          uVar3 = 0x3a;
          break;
        case 0x3b:
          current_key = 'W';
          current_shift = '\0';
          uVar3 = 0x3b;
          break;
        case 0x3c:
          current_key = 'f';
          current_shift = '\x01';
          uVar3 = 0x3c;
          break;
        case 0x3d:
          current_key = '\x17';
          current_shift = '\x01';
          uVar3 = 0x3d;
          break;
        case 0x3e:
          current_key = 'g';
          current_shift = '\x01';
          uVar3 = 0x3e;
          break;
        case 0x3f:
          current_key = 'h';
          current_shift = '\x01';
          uVar3 = 0x3f;
          break;
        case 0x40:
          current_key = 'G';
          current_shift = '\0';
          uVar3 = 0x40;
          break;
        case 0x41:
          current_key = 'A';
          current_shift = '\x01';
          uVar3 = 0x41;
          break;
        case 0x42:
          current_key = 'd';
          current_shift = '\x01';
          uVar3 = 0x42;
          break;
        case 0x43:
          current_key = 'R';
          current_shift = '\x01';
          uVar3 = 0x43;
          break;
        case 0x44:
          current_key = '2';
          current_shift = '\x01';
          uVar3 = 0x44;
          break;
        case 0x45:
          current_key = '\"';
          current_shift = '\x01';
          uVar3 = 0x45;
          break;
        case 0x46:
          current_key = 'C';
          current_shift = '\x01';
          uVar3 = 0x46;
          break;
        case 0x47:
          current_key = 'S';
          current_shift = '\x01';
          uVar3 = 0x47;
          break;
        case 0x48:
          current_key = 'T';
          current_shift = '\x01';
          uVar3 = 0x48;
          break;
        case 0x49:
          current_key = '%';
          current_shift = '\x01';
          uVar3 = 0x49;
          break;
        case 0x4a:
          current_key = 'E';
          current_shift = '\x01';
          uVar3 = 0x4a;
          break;
        case 0x4b:
          current_key = 'F';
          current_shift = '\x01';
          uVar3 = 0x4b;
          break;
        case 0x4c:
          current_key = 'V';
          current_shift = '\x01';
          uVar3 = 0x4c;
          break;
        case 0x4d:
          current_key = 'e';
          current_shift = '\x01';
          uVar3 = 0x4d;
          break;
        case 0x4e:
          current_key = 'U';
          current_shift = '\x01';
          uVar3 = 0x4e;
          break;
        case 0x4f:
          current_key = '6';
          current_shift = '\x01';
          uVar3 = 0x4f;
          break;
        case 0x50:
          current_key = '7';
          current_shift = '\x01';
          uVar3 = 0x50;
          break;
        case 0x51:
          current_key = '\x10';
          current_shift = '\x01';
          uVar3 = 0x51;
          break;
        case 0x52:
          current_key = '3';
          current_shift = '\x01';
          uVar3 = 0x52;
          break;
        case 0x53:
          current_key = 'Q';
          current_shift = '\x01';
          uVar3 = 0x53;
          break;
        case 0x54:
          current_key = '#';
          current_shift = '\x01';
          uVar3 = 0x54;
          break;
        case 0x55:
          current_key = '5';
          current_shift = '\x01';
          uVar3 = 0x55;
          break;
        case 0x56:
          current_key = 'c';
          current_shift = '\x01';
          uVar3 = 0x56;
          break;
        case 0x57:
          current_key = '!';
          current_shift = '\x01';
          uVar3 = 0x57;
          break;
        case 0x58:
          current_key = 'B';
          current_shift = '\x01';
          uVar3 = 0x58;
          break;
        case 0x59:
          current_key = 'D';
          current_shift = '\x01';
          uVar3 = 0x59;
          break;
        case 0x5a:
          current_key = 'a';
          current_shift = '\x01';
          uVar3 = 0x5a;
          break;
        case 0x5b:
          current_key = '8';
          current_shift = '\0';
          uVar3 = 0x5b;
          break;
        case 0x5c:
          current_key = 'x';
          current_shift = '\0';
          uVar3 = 0x5c;
          break;
        case 0x5d:
          current_key = 'X';
          current_shift = '\0';
          uVar3 = 0x5d;
          break;
        case 0x5e:
          current_key = '\x18';
          current_shift = '\0';
          uVar3 = 0x5e;
          break;
        case 0x5f:
          current_key = '(';
          current_shift = '\0';
          uVar3 = 0x5f;
          break;
        case 0x60:
          current_control = '\x01';
          uVar3 = 0x60;
          break;
        case 0x61:
          current_key = 'A';
          current_shift = '\0';
          uVar3 = 0x61;
          break;
        case 0x62:
          current_key = 'd';
          current_shift = '\0';
          uVar3 = 0x62;
          break;
        case 99:
          current_key = 'R';
          current_shift = '\0';
          uVar3 = 99;
          break;
        case 100:
          current_key = '2';
          current_shift = '\0';
          uVar3 = 100;
          break;
        case 0x65:
          current_key = '\"';
          current_shift = '\0';
          uVar3 = 0x65;
          break;
        case 0x66:
          current_key = 'C';
          current_shift = '\0';
          uVar3 = 0x66;
          break;
        case 0x67:
          current_key = 'S';
          current_shift = '\0';
          uVar3 = 0x67;
          break;
        case 0x68:
          current_key = 'T';
          current_shift = '\0';
          uVar3 = 0x68;
          break;
        case 0x69:
          current_key = '%';
          current_shift = '\0';
          uVar3 = 0x69;
          break;
        case 0x6a:
          current_key = 'E';
          current_shift = '\0';
          uVar3 = 0x6a;
          break;
        case 0x6b:
          current_key = 'F';
          current_shift = '\0';
          uVar3 = 0x6b;
          break;
        case 0x6c:
          current_key = 'V';
          current_shift = '\0';
          uVar3 = 0x6c;
          break;
        case 0x6d:
          current_key = 'e';
          current_shift = '\0';
          uVar3 = 0x6d;
          break;
        case 0x6e:
          current_key = 'U';
          current_shift = '\0';
          uVar3 = 0x6e;
          break;
        case 0x6f:
          current_key = '6';
          current_shift = '\0';
          uVar3 = 0x6f;
          break;
        case 0x70:
          current_key = '7';
          current_shift = '\0';
          uVar3 = 0x70;
          break;
        case 0x71:
          current_key = '\x10';
          current_shift = '\0';
          uVar3 = 0x71;
          break;
        case 0x72:
          current_key = '3';
          current_shift = '\0';
          uVar3 = 0x72;
          break;
        case 0x73:
          current_key = 'Q';
          current_shift = '\0';
          uVar3 = 0x73;
          break;
        case 0x74:
          current_key = '#';
          current_shift = '\0';
          uVar3 = 0x74;
          break;
        case 0x75:
          current_key = '5';
          current_shift = '\0';
          uVar3 = 0x75;
          break;
        case 0x76:
          current_key = 'c';
          current_shift = '\0';
          uVar3 = 0x76;
          break;
        case 0x77:
          current_key = '!';
          current_shift = '\0';
          uVar3 = 0x77;
          break;
        case 0x78:
          current_key = 'B';
          current_shift = '\0';
          uVar3 = 0x78;
          break;
        case 0x79:
          current_key = 'D';
          current_shift = '\0';
          uVar3 = 0x79;
          break;
        case 0x7a:
          current_key = 'a';
          current_shift = '\0';
          uVar3 = 0x7a;
          break;
        case 0x7b:
          current_key = '8';
          current_shift = '\x01';
          uVar3 = 0x7b;
          break;
        case 0x7c:
          current_key = 'x';
          current_shift = '\x01';
          uVar3 = 0x7c;
          break;
        case 0x7d:
          current_key = 'X';
          current_shift = '\x01';
          uVar3 = 0x7d;
          break;
        case 0x7e:
          current_key = '\x18';
          current_shift = '\x01';
          uVar3 = 0x7e;
        }
      }
      if ((s_via[0xe] & 1) == 0) {
        s_via[0xd] = s_via[0xd] | 1;
      }
      else {
        s_via[0xd] = s_via[0xd] | 0x81;
        irq();
      }
      uVar4 = (ulong)(-1 < (char)uVar3);
      getkey::old_scan_code = uVar3;
    }
    else {
      bVar1 = _bios_keybrd(0);
      if (getkey::old_scan_code == bVar1) {
        coniogetch();
      }
    }
  }
  if (getkey::pressed == '\0') {
    asm("push AX");
    asm("pop pc_scan_code");
    if ((char)uVar4 == '\0') {
      current_key = '\0';
      current_shift = '\0';
      current_control = '\0';
    }
    if (getkey::pressed == '\0') {
      return;
    }
  }
  getkey::pressed = getkey::pressed + 0xff;
  return;
}

Assistant:

void getkey(void) {

    uint pc_scan_code;
    static uint old_scan_code;
    static ubyte pressed = 0;
    // If no key is pressed,
    if (!pressed) {                       // get the shift status
        current_shift = (_bios_keybrd(_KEYBRD_SHIFTSTATUS) & 3);
    }

    if (_bios_keybrd(_KEYBRD_READY)) {    // if a keystroke is waiting
        if (!pressed) {                    // and if not key is being processed

            // Synchronise BBC and PC capslock

            switch ((peekb(0, 0x417) & 0x40) | s_via_latch[6]) {
                case 0x48:
                case 0x00:
                    current_key = 0x40;
                    goto caps_lock_pressed;
            }


            // get pc keystroke
            pc_scan_code = _bios_keybrd(_KEYBRD_READ);
            pressed = 7;                       // hold the key for 7 interrupts

            switch (pc_scan_code & 0xff) {

/**********************************************

		Keyboard Translation statements

**********************************************/

                case 0x8:
                    current_key = 0x59;
                    CLEAR;
                    break;
                case 0x9:
                    current_key = 0x60;
                    CLEAR;
                    break;
                case 0xD:
                    current_key = 0x49;
                    CLEAR;
                    break;
                case 0x1B:
                    current_key = 0x70;
                    CLEAR;
                    break;
                case ' ':
                    current_key = 0x62;
                    CLEAR;
                    break;
                case '!':
                    current_key = 0x30;
                    SHIFT;
                    break;
                case '"':
                    current_key = 0x31;
                    SHIFT;
                    break;
                case '#':
                    current_key = 0x11;
                    SHIFT;
                    break;
                case '$':
                    current_key = 0x12;
                    SHIFT;
                    break;
                case '%':
                    current_key = 0x13;
                    SHIFT;
                    break;
                case '&':
                    current_key = 0x34;
                    SHIFT;
                    break;
                case '\'':
                    current_key = 0x24;
                    SHIFT;
                    break;
                case '(':
                    current_key = 0x15;
                    SHIFT;
                    break;
                case ')':
                    current_key = 0x26;
                    SHIFT;
                    break;
                case '*':
                    current_key = 0x48;
                    SHIFT;
                    break;
                case '+':
                    current_key = 0x57;
                    SHIFT;
                    break;
                case ',':
                    current_key = 0x66;
                    CLEAR;
                    break;
                case '-':
                    current_key = 0x17;
                    CLEAR;
                    break;
                case '.':
                    current_key = 0x67;
                    CLEAR;
                    break;
                case '/':
                    current_key = 0x68;
                    CLEAR;
                    break;
                case '0':
                    current_key = 0x27;
                    CLEAR;
                    break;
                case '1':
                    current_key = 0x30;
                    CLEAR;
                    break;
                case '2':
                    current_key = 0x31;
                    CLEAR;
                    break;
                case '3':
                    current_key = 0x11;
                    CLEAR;
                    break;
                case '4':
                    current_key = 0x12;
                    CLEAR;
                    break;
                case '5':
                    current_key = 0x13;
                    CLEAR;
                    break;
                case '6':
                    current_key = 0x34;
                    CLEAR;
                    break;
                case '7':
                    current_key = 0x24;
                    CLEAR;
                    break;
                case '8':
                    current_key = 0x15;
                    CLEAR;
                    break;
                case '9':
                    current_key = 0x26;
                    CLEAR;
                    break;
                case ':':
                    current_key = 0x48;
                    CLEAR;
                    break;
                case ';':
                    current_key = 0x57;
                    CLEAR;
                    break;
                case '<':
                    current_key = 0x66;
                    SHIFT;
                    break;
                case '=':
                    current_key = 0x17;
                    SHIFT;
                    break;
                case '>':
                    current_key = 0x67;
                    SHIFT;
                    break;
                case '?':
                    current_key = 0x68;
                    SHIFT;
                    break;
                case '@':
                    current_key = 0x47;
                    CLEAR;
                    break;
                case 'A':
                    current_key = 0x41;
                    SHIFT;
                    break;
                case 'B':
                    current_key = 0x64;
                    SHIFT;
                    break;
                case 'C':
                    current_key = 0x52;
                    SHIFT;
                    break;
                case 'D':
                    current_key = 0x32;
                    SHIFT;
                    break;
                case 'E':
                    current_key = 0x22;
                    SHIFT;
                    break;
                case 'F':
                    current_key = 0x43;
                    SHIFT;
                    break;
                case 'G':
                    current_key = 0x53;
                    SHIFT;
                    break;
                case 'H':
                    current_key = 0x54;
                    SHIFT;
                    break;
                case 'I':
                    current_key = 0x25;
                    SHIFT;
                    break;
                case 'J':
                    current_key = 0x45;
                    SHIFT;
                    break;
                case 'K':
                    current_key = 0x46;
                    SHIFT;
                    break;
                case 'L':
                    current_key = 0x56;
                    SHIFT;
                    break;
                case 'M':
                    current_key = 0x65;
                    SHIFT;
                    break;
                case 'N':
                    current_key = 0x55;
                    SHIFT;
                    break;
                case 'O':
                    current_key = 0x36;
                    SHIFT;
                    break;
                case 'P':
                    current_key = 0x37;
                    SHIFT;
                    break;
                case 'Q':
                    current_key = 0x10;
                    SHIFT;
                    break;
                case 'R':
                    current_key = 0x33;
                    SHIFT;
                    break;
                case 'S':
                    current_key = 0x51;
                    SHIFT;
                    break;
                case 'T':
                    current_key = 0x23;
                    SHIFT;
                    break;
                case 'U':
                    current_key = 0x35;
                    SHIFT;
                    break;
                case 'V':
                    current_key = 0x63;
                    SHIFT;
                    break;
                case 'W':
                    current_key = 0x21;
                    SHIFT;
                    break;
                case 'X':
                    current_key = 0x42;
                    SHIFT;
                    break;
                case 'Y':
                    current_key = 0x44;
                    SHIFT;
                    break;
                case 'Z':
                    current_key = 0x61;
                    SHIFT;
                    break;
                case '[':
                    current_key = 0x38;
                    CLEAR;
                    break;
                case '\\':
                    current_key = 0x78;
                    CLEAR;
                    break;
                case ']':
                    current_key = 0x58;
                    CLEAR;
                    break;
                case '^':
                    current_key = 0x18;
                    CLEAR;
                    break;
                case '_':
                    current_key = 0x28;
                    CLEAR;
                    break;
                case '`':
                    current_control = 1;
                    break;
                case 'a':
                    current_key = 0x41;
                    CLEAR;
                    break;
                case 'b':
                    current_key = 0x64;
                    CLEAR;
                    break;
                case 'c':
                    current_key = 0x52;
                    CLEAR;
                    break;
                case 'd':
                    current_key = 0x32;
                    CLEAR;
                    break;
                case 'e':
                    current_key = 0x22;
                    CLEAR;
                    break;
                case 'f':
                    current_key = 0x43;
                    CLEAR;
                    break;
                case 'g':
                    current_key = 0x53;
                    CLEAR;
                    break;
                case 'h':
                    current_key = 0x54;
                    CLEAR;
                    break;
                case 'i':
                    current_key = 0x25;
                    CLEAR;
                    break;
                case 'j':
                    current_key = 0x45;
                    CLEAR;
                    break;
                case 'k':
                    current_key = 0x46;
                    CLEAR;
                    break;
                case 'l':
                    current_key = 0x56;
                    CLEAR;
                    break;
                case 'm':
                    current_key = 0x65;
                    CLEAR;
                    break;
                case 'n':
                    current_key = 0x55;
                    CLEAR;
                    break;
                case 'o':
                    current_key = 0x36;
                    CLEAR;
                    break;
                case 'p':
                    current_key = 0x37;
                    CLEAR;
                    break;
                case 'q':
                    current_key = 0x10;
                    CLEAR;
                    break;
                case 'r':
                    current_key = 0x33;
                    CLEAR;
                    break;
                case 's':
                    current_key = 0x51;
                    CLEAR;
                    break;
                case 't':
                    current_key = 0x23;
                    CLEAR;
                    break;
                case 'u':
                    current_key = 0x35;
                    CLEAR;
                    break;
                case 'v':
                    current_key = 0x63;
                    CLEAR;
                    break;
                case 'w':
                    current_key = 0x21;
                    CLEAR;
                    break;
                case 'x':
                    current_key = 0x42;
                    CLEAR;
                    break;
                case 'y':
                    current_key = 0x44;
                    CLEAR;
                    break;
                case 'z':
                    current_key = 0x61;
                    CLEAR;
                    break;
                case '{':
                    current_key = 0x38;
                    SHIFT;
                    break;
                case '|':
                    current_key = 0x78;
                    SHIFT;
                    break;
                case '}':
                    current_key = 0x58;
                    SHIFT;
                    break;
                case '~':
                    current_key = 0x18;
                    SHIFT;
                    break;
                    //case '�':	current_key=0x28;SHIFT;break; // TODO DOS / ASCII mismatch

                case 0:
                    switch (pc_scan_code / 0x100) {

                        case 0x3B:
                            current_key = 0x71;
                            break;
                        case 0x3C:
                            current_key = 0x72;
                            break;
                        case 0x3D:
                            current_key = 0x73;
                            break;
                        case 0x3E:
                            current_key = 0x14;
                            break;
                        case 0x3F:
                            current_key = 0x74;
                            break;
                        case 0x40:
                            current_key = 0x75;
                            break;
                        case 0x41:
                            current_key = 0x16;
                            break;
                        case 0x42:
                            current_key = 0x76;
                            break;
                        case 0x43:
                            current_key = 0x77;
                            break;
                        case 0x44:
                            current_key = 0x20;
                            break;
                            /*	case 0x47: monitor_call();return;   The home key */
                        case 0x48:
                            current_key = 0x39;
                            break;
                        case 0x4B:
                            current_key = 0x19;
                            break;
                        case 0x4D:
                            current_key = 0x79;
                            break;
                        case 0x4F:
                            current_key = 0x69;
                            break;
                        case 0x50:
                            current_key = 0x29;
                            break;
                    }
            }


/**********************************************
**********************************************/

            caps_lock_pressed:

            if (s_via[IER] & 0x01) {    // if relevant interrupts are enabled
                s_via[IFR] |= 0x81;      // generate the interrupt
                irq();
            }
            else s_via[IFR] |= 0x01;
            old_scan_code = pc_scan_code; // store a copy of the current key
        }
            // discard key repeats of the same key
        else if (_bios_keybrd(_KEYBRD_READY) == old_scan_code) coniogetch();
    }

    if (!pressed) {

        /* TODO this is an x86 keyboard read
        asm("IN AL,0x60"); */
        asm("push AX");
        asm("pop pc_scan_code");

        if (pc_scan_code & 0x80) {      // detect if no keys are physically
            current_key = 0;             // pressed
            current_shift = 0;
            current_control = 0;
        }
    }


    if (pressed) pressed--;                // decrease the current key counter
}